

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Float __thiscall pbrt::SummedAreaTable::Sum(SummedAreaTable *this,Bounds2f *extent)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  dVar1 = lookup(this,(extent->pMax).super_Tuple2<pbrt::Point2,_float>.x,
                 (extent->pMax).super_Tuple2<pbrt::Point2,_float>.y);
  dVar2 = lookup(this,(extent->pMin).super_Tuple2<pbrt::Point2,_float>.x,
                 (extent->pMax).super_Tuple2<pbrt::Point2,_float>.y);
  dVar3 = lookup(this,(extent->pMin).super_Tuple2<pbrt::Point2,_float>.x,
                 (extent->pMin).super_Tuple2<pbrt::Point2,_float>.y);
  dVar4 = lookup(this,(extent->pMax).super_Tuple2<pbrt::Point2,_float>.x,
                 (extent->pMin).super_Tuple2<pbrt::Point2,_float>.y);
  dVar1 = (dVar3 - dVar4) + (dVar1 - dVar2);
  auVar5._0_4_ = (float)dVar1;
  auVar5._4_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar5._8_8_ = 0;
  auVar5 = vmaxss_avx(ZEXT816(0),auVar5);
  return auVar5._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Sum(const Bounds2f &extent) const {
        double s = ((lookup(extent.pMax.x, extent.pMax.y) -
                     lookup(extent.pMin.x, extent.pMax.y)) +
                    (lookup(extent.pMin.x, extent.pMin.y) -
                     lookup(extent.pMax.x, extent.pMin.y)));
        return std::max<Float>(s, 0);
    }